

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall font2svg::glyph::axes_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  string *psVar1;
  ostream *poVar2;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_59);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_50);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw axes --> ");
  poVar2 = std::operator<<((ostream *)&this->field_0x270,
                           "\n <path stroke=\'blue\' stroke-dasharray=\'5,5\' d=\'");
  poVar2 = std::operator<<(poVar2," M");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,-this->bbwidth);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2," L");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bbwidth);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2," M");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,-this->bbheight);
  poVar2 = std::operator<<(poVar2," L");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bbheight);
  std::operator<<(poVar2," \'/>");
  psVar1 = local_58;
  std::__cxx11::stringbuf::str();
  return psVar1;
}

Assistant:

std::string axes()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw axes --> ";
		tmp << "\n <path stroke='blue' stroke-dasharray='5,5' d='"
			<< " M" << -bbwidth << "," << 0
			<< " L" <<  bbwidth << "," << 0
			<< " M" << 0 << "," << -bbheight
			<< " L" << 0 << "," << bbheight
			<< " '/>";
		return tmp.str();
	}